

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Options *options,FieldDescriptor *field)

{
  float value;
  double value_00;
  once_flag *__once;
  Descriptor *this_00;
  undefined8 *puVar1;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar2;
  LogMessage *other;
  long *plVar3;
  long lVar4;
  uint *options_00;
  size_type *psVar5;
  int number;
  Options *extraout_RDX;
  Options *pOVar6;
  ulong uVar7;
  char *pcVar8;
  protobuf *this_02;
  char *pcVar9;
  SubstituteArg *in_stack_fffffffffffffd38;
  undefined1 local_2c0 [48];
  undefined1 local_290 [16];
  undefined1 local_280 [152];
  undefined4 local_1e8;
  undefined1 local_1e0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [32];
  undefined1 local_180 [48];
  SubstituteArg local_150;
  undefined1 local_120 [48];
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  __once = (once_flag *)(options->runtime_include_base)._M_dataplus._M_p;
  pOVar6 = options;
  this_02 = (protobuf *)this;
  if (__once != (once_flag *)0x0) {
    this_02 = (protobuf *)local_290;
    local_290._0_8_ = FieldDescriptor::TypeOnceInit;
    local_2c0._0_8_ = options;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (__once,(_func_void_FieldDescriptor_ptr **)this_02,(FieldDescriptor **)local_2c0);
    pOVar6 = extraout_RDX;
  }
  options_00 = &switchD_00233654::switchdataD_00391bb8;
  switch(*(undefined4 *)
          (FieldDescriptor::kTypeToCppTypeMap +
          (ulong)(uint)(options->runtime_include_base)._M_string_length * 4)) {
  case 1:
    Int32ToString_abi_cxx11_
              (__return_storage_ptr__,
               (cpp *)(ulong)*(uint *)((long)&(options->annotation_guard_name).field_2 + 8),
               (int)pOVar6);
    return __return_storage_ptr__;
  case 2:
    local_290._0_8_ = (Options *)local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"PROTOBUF","");
    Int64ToString(__return_storage_ptr__,(string *)local_290,
                  *(int64 *)((long)&(options->annotation_guard_name).field_2 + 8));
    local_1e0._16_8_ = local_290._0_8_;
    if ((Options *)local_290._0_8_ == (Options *)local_280) {
      return __return_storage_ptr__;
    }
    break;
  case 3:
    local_290._0_8_ = (Options *)local_280;
    local_290._8_8_ =
         FastUInt32ToBufferLeft
                   (*(uint32 *)((long)&(options->annotation_guard_name).field_2 + 8),
                    (char *)local_280);
    local_290._8_8_ = local_290._8_8_ + -(long)local_280;
    local_2c0._0_8_ = (Options *)(local_2c0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c0,local_290._0_8_,(char *)(local_290._8_8_ + local_290._0_8_));
    plVar3 = (long *)std::__cxx11::string::append((char *)local_2c0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar4 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_1e0._16_8_ = local_2c0._0_8_;
    if ((Options *)local_2c0._0_8_ == (Options *)(local_2c0 + 0x10)) {
      return __return_storage_ptr__;
    }
    break;
  case 4:
    local_290._0_8_ = (Options *)local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"PROTOBUF","");
    UInt64ToString(__return_storage_ptr__,(string *)local_290,
                   *(uint64 *)((long)&(options->annotation_guard_name).field_2 + 8));
    local_1e0._16_8_ = local_290._0_8_;
    if ((Options *)local_290._0_8_ == (Options *)local_280) {
      return __return_storage_ptr__;
    }
    break;
  case 5:
    value_00 = *(double *)((long)&(options->annotation_guard_name).field_2 + 8);
    if (value_00 < INFINITY) {
      if (-INFINITY < value_00) {
        if (!NAN(value_00)) {
          SimpleDtoa_abi_cxx11_(__return_storage_ptr__,this_02,value_00);
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar9 = "std::numeric_limits<double>::quiet_NaN()";
        pcVar8 = "";
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar9 = "-std::numeric_limits<double>::infinity()";
        pcVar8 = "";
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "std::numeric_limits<double>::infinity()";
      pcVar8 = "";
    }
    goto LAB_00233a98;
  case 6:
    value = *(float *)((long)&(options->annotation_guard_name).field_2 + 8);
    if (value < INFINITY) {
      if (-INFINITY < value) {
        if (!NAN(value)) {
          SimpleFtoa_abi_cxx11_(__return_storage_ptr__,this_02,value);
          lVar4 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x39203f,0);
          if (lVar4 == -1) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar9 = "std::numeric_limits<float>::quiet_NaN()";
        pcVar8 = "";
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar9 = "-std::numeric_limits<float>::infinity()";
        pcVar8 = "";
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "std::numeric_limits<float>::infinity()";
      pcVar8 = "";
    }
    goto LAB_00233a98;
  case 7:
    uVar7 = (ulong)(byte)(options->annotation_guard_name).field_2._M_local_buf[8];
    pcVar9 = "false";
    if (uVar7 != 0) {
      pcVar9 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = pcVar9 + (uVar7 ^ 5);
    goto LAB_00233a98;
  case 8:
    this_01 = FieldDescriptor::enum_type((FieldDescriptor *)options);
    memset(local_280,0,0x88);
    local_290._8_8_ = (char *)0x0;
    local_280[0x12] = '\x01';
    local_280._19_7_ = 0;
    local_280._26_4_ = 0;
    local_280._72_8_ = local_280 + 0x58;
    local_280._136_8_ = 0;
    local_290._0_8_ = local_280;
    local_280._32_8_ = local_280 + 0x30;
    local_280._104_8_ = local_280 + 0x78;
    QualifiedClassName_abi_cxx11_
              ((string *)(local_1e0 + 0x10),(cpp *)this_01,(EnumDescriptor *)local_290,
               (Options *)options_00);
    if ((undefined1 *)local_280._104_8_ != local_280 + 0x78) {
      operator_delete((void *)local_280._104_8_);
    }
    if ((undefined1 *)local_280._72_8_ != local_280 + 0x58) {
      operator_delete((void *)local_280._72_8_);
    }
    if ((undefined1 *)local_280._32_8_ != local_280 + 0x30) {
      operator_delete((void *)local_280._32_8_);
    }
    if ((undefined1 *)local_290._0_8_ != local_280) {
      operator_delete((void *)local_290._0_8_);
    }
    local_2c0._0_8_ = local_1e0._16_8_;
    local_2c0._8_4_ = local_1e0._24_4_;
    pEVar2 = FieldDescriptor::default_value_enum((FieldDescriptor *)options);
    Int32ToString_abi_cxx11_
              ((string *)(local_280 + 0x90),(cpp *)(ulong)*(uint *)(pEVar2 + 0x10),number);
    local_290._0_8_ = local_280._144_8_;
    local_290._8_4_ = local_1e8;
    local_1b0._M_allocated_capacity = 0;
    local_1b0._8_4_ = 0xffffffff;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120._0_8_ = (char *)0x0;
    local_120._8_4_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180._0_8_ = (char *)0x0;
    local_180._8_4_ = -1;
    strings::Substitute_abi_cxx11_
              (__return_storage_ptr__,(strings *)"static_cast< $0 >($1)",local_2c0,
               (SubstituteArg *)local_290,(SubstituteArg *)&local_1b0,&local_60,&local_90,&local_c0,
               &local_f0,(SubstituteArg *)local_120,&local_150,(SubstituteArg *)local_180,
               in_stack_fffffffffffffd38);
    if ((Options *)local_280._144_8_ != (Options *)local_1e0) {
      operator_delete((void *)local_280._144_8_);
    }
    if ((Options *)local_1e0._16_8_ == (Options *)(local_1e0 + 0x20)) {
      return __return_storage_ptr__;
    }
    break;
  case 9:
    CEscape((string *)&local_1b0,*(string **)((long)&(options->annotation_guard_name).field_2 + 8));
    EscapeTrigraphs((string *)local_2c0,(string *)&local_1b0);
    puVar1 = (undefined8 *)std::__cxx11::string::replace((ulong)local_2c0,0,(char *)0x0,0x395884);
    pOVar6 = (Options *)(puVar1 + 2);
    if ((Options *)*puVar1 == pOVar6) {
      local_280._0_8_ = (pOVar6->dllexport_decl)._M_dataplus._M_p;
      local_280._8_8_ = puVar1[3];
      local_290._0_8_ = (Options *)local_280;
    }
    else {
      local_280._0_8_ = (pOVar6->dllexport_decl)._M_dataplus._M_p;
      local_290._0_8_ = (Options *)*puVar1;
    }
    local_290._8_8_ = puVar1[1];
    *puVar1 = pOVar6;
    puVar1[1] = 0;
    *(undefined1 *)(puVar1 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(local_290);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar4 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((Options *)local_290._0_8_ != (Options *)local_280) {
      operator_delete((void *)local_290._0_8_);
    }
    if ((Options *)local_2c0._0_8_ != (Options *)(local_2c0 + 0x10)) {
      operator_delete((void *)local_2c0._0_8_);
    }
    local_1e0._16_8_ = local_1b0._M_allocated_capacity;
    if ((Options *)local_1b0._M_allocated_capacity == (Options *)local_1a0) {
      return __return_storage_ptr__;
    }
    break;
  case 10:
    this_00 = FieldDescriptor::message_type((FieldDescriptor *)options);
    QualifiedClassName_abi_cxx11_
              ((string *)local_2c0,(cpp *)this_00,(Descriptor *)this,(Options *)options_00);
    puVar1 = (undefined8 *)std::__cxx11::string::replace((ulong)local_2c0,0,(char *)0x0,0x38f541);
    pOVar6 = (Options *)(puVar1 + 2);
    if ((Options *)*puVar1 == pOVar6) {
      local_280._0_8_ = (pOVar6->dllexport_decl)._M_dataplus._M_p;
      local_280._8_8_ = puVar1[3];
      local_290._0_8_ = (Options *)local_280;
    }
    else {
      local_280._0_8_ = (pOVar6->dllexport_decl)._M_dataplus._M_p;
      local_290._0_8_ = (Options *)*puVar1;
    }
    local_290._8_8_ = puVar1[1];
    *puVar1 = pOVar6;
    puVar1[1] = 0;
    *(undefined1 *)(puVar1 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(local_290);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar4 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((Options *)local_290._0_8_ != (Options *)local_280) {
      operator_delete((void *)local_290._0_8_);
    }
    local_1e0._16_8_ = local_2c0._0_8_;
    if ((Options *)local_2c0._0_8_ == (Options *)(local_2c0 + 0x10)) {
      return __return_storage_ptr__;
    }
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_290,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x2b5);
    other = internal::LogMessage::operator<<((LogMessage *)local_290,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)local_2c0,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_290);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "";
    pcVar9 = "";
LAB_00233a98:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar8);
    return __return_storage_ptr__;
  }
  operator_delete((void *)local_1e0._16_8_);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const Options& options, const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return Int32ToString(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return StrCat(field->default_value_uint32()) + "u";
    case FieldDescriptor::CPPTYPE_INT64:
      return Int64ToString("PROTOBUF", field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT64:
      return UInt64ToString("PROTOBUF", field->default_value_uint64());
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "std::numeric_limits<double>::infinity()";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "-std::numeric_limits<double>::infinity()";
      } else if (value != value) {
        return "std::numeric_limits<double>::quiet_NaN()";
      } else {
        return SimpleDtoa(value);
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "std::numeric_limits<float>::infinity()";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "-std::numeric_limits<float>::infinity()";
      } else if (value != value) {
        return "std::numeric_limits<float>::quiet_NaN()";
      } else {
        std::string float_value = SimpleFtoa(value);
        // If floating point value contains a period (.) or an exponent
        // (either E or e), then append suffix 'f' to make it a float
        // literal.
        if (float_value.find_first_of(".eE") != string::npos) {
          float_value.push_back('f');
        }
        return float_value;
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      // Lazy:  Generate a static_cast because we don't have a helper function
      //   that constructs the full name of an enum value.
      return strings::Substitute(
          "static_cast< $0 >($1)", ClassName(field->enum_type(), true),
          Int32ToString(field->default_value_enum()->number()));
    case FieldDescriptor::CPPTYPE_STRING:
      return "\"" +
             EscapeTrigraphs(CEscape(field->default_value_string())) +
             "\"";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "*" + FieldMessageTypeName(field, options) +
             "::internal_default_instance()";
  }
  // Can't actually get here; make compiler happy.  (We could add a default
  // case above but then we wouldn't get the nice compiler warning when a
  // new type is added.)
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}